

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<0,_11,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int col;
  long lVar8;
  int col_1;
  float fVar9;
  float fVar10;
  float local_68 [8];
  undefined8 local_48;
  float local_40;
  Type in0;
  int aiStack_18 [6];
  
  pfVar7 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar6 = (float *)&in0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        fVar9 = 1.0;
        if (lVar5 != lVar8) {
          fVar9 = 0.0;
        }
        pfVar6[lVar8 * 2] = fVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 1;
      pfVar6 = pfVar7;
      bVar3 = false;
    } while (bVar4);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in0.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[3].m_data[0] = 0.0;
    in0.m_data.m_data[3].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar6 = (float *)&in0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        pfVar6[lVar8 * 2] = *(float *)((long)&s_constInMat4x2 + lVar5 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 0x10;
      pfVar6 = pfVar7;
      bVar3 = false;
    } while (bVar4);
  }
  fVar9 = (evalCtx->coords).m_data[0];
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  lVar5 = 0;
  pfVar7 = local_68;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar8 = 0;
    do {
      fVar10 = 1.0;
      if (lVar5 != lVar8) {
        fVar10 = 0.0;
      }
      pfVar7[lVar8 * 2] = fVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar5 = 1;
    pfVar7 = local_68 + 1;
    bVar3 = false;
  } while (bVar4);
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar9 = -0.2;
  }
  lVar5 = 0;
  do {
    fVar10 = in0.m_data.m_data[lVar5].m_data[1];
    fVar1 = in0.m_data.m_data[lVar5 + 1].m_data[0];
    fVar2 = in0.m_data.m_data[lVar5 + 1].m_data[1];
    local_68[lVar5 * 2] = in0.m_data.m_data[lVar5].m_data[0] + fVar9;
    local_68[lVar5 * 2 + 1] = fVar10 + fVar9;
    local_68[lVar5 * 2 + 2] = fVar1 + fVar9;
    local_68[lVar5 * 2 + 3] = fVar2 + fVar9;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  local_48 = CONCAT44(SUB84(local_68._24_8_,4) + local_68[3] + local_68[2],
                      (float)local_68._24_8_ + local_68[0] + local_68[1]);
  local_40 = local_68[4] + local_68[5];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = local_68[lVar5 + 6];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}